

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall Func::InitializeEquivalentTypeGuard(Func *this,JitEquivalentTypeGuard *guard)

{
  EquivalentTypeCache *pEVar1;
  JitEquivalentTypeGuard *local_28;
  JitEquivalentTypeGuard *guard_local;
  
  local_28 = guard;
  pEVar1 = (EquivalentTypeCache *)
           new<NativeCodeData::AllocatorNoFixup<Js::EquivalentTypeCache>>
                     (0x60,(AllocatorNoFixup<Js::EquivalentTypeCache> *)
                           &this->topFunc->transferDataAllocator,0x40db1e);
  pEVar1->nextEvictionVictim = 8;
  guard->cache = pEVar1;
  pEVar1->guard = (PropertyGuard *)guard;
  SList<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&this->equivalentTypeGuards->
              super_SList<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>,&local_28
            );
  return;
}

Assistant:

void
Func::InitializeEquivalentTypeGuard(Js::JitEquivalentTypeGuard * guard)
{
    // If we want to hard code the address of the cache, we will need to go back to allocating it from the native code data allocator.
    // We would then need to maintain consistency (double write) to both the recycler allocated cache and the one on the heap.
    Js::EquivalentTypeCache* cache = nullptr;
    if (this->IsOOPJIT())
    {
        cache = JitAnewZ(this->m_alloc, Js::EquivalentTypeCache);
    }
    else
    {
        cache = NativeCodeDataNewZNoFixup(GetTransferDataAllocator(), Js::EquivalentTypeCache);
    }
    guard->SetCache(cache);

    // Give the cache a back-pointer to the guard so that the guard can be cleared at runtime if necessary.
    cache->SetGuard(guard);
    this->equivalentTypeGuards->Prepend(guard);
}